

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O2

shared_ptr<mcc::Token> __thiscall mcc::Scanner::GetToken(Scanner *this)

{
  uint int_value;
  ErrorReporter *pEVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  TokenType TVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  Scanner *in_RSI;
  shared_ptr<mcc::Token> sVar7;
  string identifier;
  allocator<char> local_89;
  string local_88;
  string local_68 [32];
  string local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  cVar2 = NextCharSkipSpaces(in_RSI);
  sVar7 = std::make_shared<mcc::Token>();
  _Var6 = sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pEVar1 = this->reporter_;
  *(int *)&(pEVar1->input_file_)._M_dataplus._M_p = in_RSI->line_;
  *(int *)&(pEVar1->input_file_)._M_string_length = in_RSI->c_;
  switch(cVar2) {
  case '!':
    cVar2 = Next(in_RSI);
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x13;
      _Var6._M_pi = extraout_RDX;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 7;
    break;
  case '\"':
    ScanStr_abi_cxx11_(&local_48,in_RSI);
    std::__cxx11::string::operator=
              ((string *)(pEVar1->input_file_).field_2._M_local_buf,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x2f;
    _Var6._M_pi = extraout_RDX_07;
    goto LAB_0011d48d;
  case '#':
  case '$':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
switchD_0011cf3c_caseD_23:
    int_value = (int)cVar2 - 0x30;
    if (int_value < 10) {
      iVar4 = ScanInt(in_RSI,int_value);
      pEVar1 = this->reporter_;
      *(int *)((long)&(pEVar1->input_file_)._M_dataplus._M_p + 4) = iVar4;
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x2e;
      _Var6._M_pi = extraout_RDX_00;
    }
    else {
      iVar4 = isalpha((int)cVar2);
      if ((cVar2 == '_') || (iVar4 != 0)) {
        ScanIdent_abi_cxx11_(&local_88,in_RSI,cVar2);
        bVar3 = IsKeyword(in_RSI,&local_88);
        pEVar1 = this->reporter_;
        if (bVar3) {
          TVar5 = GetKeywordToken(in_RSI,&local_88);
          *(TokenType *)((long)&(pEVar1->input_file_)._M_string_length + 4) = TVar5;
        }
        else {
          *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x30;
          std::__cxx11::string::string(local_68,(string *)&local_88);
          std::__cxx11::string::operator=
                    ((string *)(pEVar1->input_file_).field_2._M_local_buf,local_68);
          std::__cxx11::string::~string(local_68);
        }
      }
      else {
        pEVar1 = in_RSI->reporter_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Unrecognizable token",&local_89);
        ErrorReporter::Report(pEVar1,&local_88,cVar2,in_RSI->line_,in_RSI->c_);
      }
      std::__cxx11::string::~string((string *)&local_88);
      _Var6._M_pi = extraout_RDX_17;
    }
    goto LAB_0011d48d;
  case '%':
    cVar2 = Next(in_RSI);
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x1d;
      _Var6._M_pi = extraout_RDX_09;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x11;
    break;
  case '&':
    cVar2 = Next(in_RSI);
    pEVar1 = this->reporter_;
    _Var6._M_pi = extraout_RDX_08;
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x20;
      goto LAB_0011d48d;
    }
    if (cVar2 == '&') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x2b;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x23;
    break;
  case '\'':
    iVar4 = ScanChar(in_RSI);
    *(int *)((long)&(pEVar1->input_file_)._M_dataplus._M_p + 4) = iVar4;
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x2e;
    cVar2 = Next(in_RSI);
    _Var6._M_pi = extraout_RDX_04;
    if (cVar2 == '\'') goto LAB_0011d48d;
    pEVar1 = in_RSI->reporter_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Char literal should end in quote",&local_89);
    ErrorReporter::Report(pEVar1,&local_88,cVar2,in_RSI->line_,in_RSI->c_);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case '(':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 1;
    goto LAB_0011d48d;
  case ')':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 2;
    goto LAB_0011d48d;
  case '*':
    cVar2 = Next(in_RSI);
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x1b;
      _Var6._M_pi = extraout_RDX_11;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0xf;
    break;
  case '+':
    cVar2 = Next(in_RSI);
    pEVar1 = this->reporter_;
    _Var6._M_pi = extraout_RDX_10;
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x19;
      goto LAB_0011d48d;
    }
    if (cVar2 == '+') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x26;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0xd;
    break;
  case ',':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 5;
    goto LAB_0011d48d;
  case '-':
    cVar2 = Next(in_RSI);
    pEVar1 = this->reporter_;
    _Var6._M_pi = extraout_RDX_02;
    if (cVar2 == '>') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 10;
      goto LAB_0011d48d;
    }
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x1a;
      goto LAB_0011d48d;
    }
    if (cVar2 == '-') {
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x27;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0xe;
    break;
  case '.':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 9;
    goto LAB_0011d48d;
  case '/':
    cVar2 = Next(in_RSI);
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x1c;
      _Var6._M_pi = extraout_RDX_05;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x10;
    break;
  case ':':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x29;
    goto LAB_0011d48d;
  case ';':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 6;
    goto LAB_0011d48d;
  case '<':
    cVar2 = Next(in_RSI);
    if (cVar2 == '<') {
      cVar2 = Next(in_RSI);
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x1e;
        _Var6._M_pi = extraout_RDX_14;
        goto LAB_0011d48d;
      }
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x2c;
    }
    else {
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x16;
        _Var6._M_pi = extraout_RDX_03;
        goto LAB_0011d48d;
      }
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x14;
    }
    break;
  case '=':
    cVar2 = Next(in_RSI);
    if (cVar2 == '=') {
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x12;
      _Var6._M_pi = extraout_RDX_01;
      goto LAB_0011d48d;
    }
    *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x18;
    break;
  case '>':
    cVar2 = Next(in_RSI);
    if (cVar2 == '>') {
      cVar2 = Next(in_RSI);
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x1f;
        _Var6._M_pi = extraout_RDX_15;
        goto LAB_0011d48d;
      }
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x2d;
    }
    else {
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x17;
        _Var6._M_pi = extraout_RDX_06;
        goto LAB_0011d48d;
      }
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x15;
    }
    break;
  case '?':
    *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x28;
    goto LAB_0011d48d;
  default:
    switch(cVar2) {
    case '{':
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 3;
      break;
    case '|':
      cVar2 = Next(in_RSI);
      pEVar1 = this->reporter_;
      _Var6._M_pi = extraout_RDX_13;
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x22;
        break;
      }
      if (cVar2 == '|') {
        *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x2a;
        break;
      }
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0x24;
      goto LAB_0011d481;
    case '}':
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 4;
      break;
    case '~':
      *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 8;
      break;
    default:
      if (cVar2 == '[') {
        *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0xb;
        break;
      }
      if (cVar2 == ']') {
        *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0xc;
        break;
      }
      if (cVar2 != '^') {
        if (cVar2 == -1) {
          *(undefined4 *)((long)&(pEVar1->input_file_)._M_string_length + 4) = 0;
          break;
        }
        goto switchD_0011cf3c_caseD_23;
      }
      cVar2 = Next(in_RSI);
      if (cVar2 == '=') {
        *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x21;
        _Var6._M_pi = extraout_RDX_12;
        break;
      }
      *(undefined4 *)((long)&(this->reporter_->input_file_)._M_string_length + 4) = 0x25;
      goto LAB_0011d481;
    }
    goto LAB_0011d48d;
  }
LAB_0011d481:
  Putback(in_RSI,cVar2);
  _Var6._M_pi = extraout_RDX_16;
LAB_0011d48d:
  sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::Token>)sVar7.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Scanner::GetToken() {
  char c = NextCharSkipSpaces();
  std::shared_ptr<Token> token = std::make_shared<Token>();
  token->SetLine(line_);
  token->SetCount(c_);
  switch (c) {
    case '+':
      if ((c = Next()) == '+') {
        token->SetType(TokenType::T_INC);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_PLUS);
      } else {
        token->SetType(TokenType::T_PLUS);
        Putback(c);
      }
      break;
    case '-':
      if ((c = Next()) == '-') {
        token->SetType(TokenType::T_DEC);
      } else if (c == '>') {
        token->SetType(TokenType::T_ARROW);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_MINUS);
      } else {
        token->SetType(TokenType::T_MINUS);
        Putback(c);
      }
      break;
    case '*':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MUL);
      } else {
        token->SetType(TokenType::T_STAR);
        Putback(c);
      }
      break;
    case '/':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_DIV);
      } else {
        token->SetType(TokenType::T_SLASH);
        Putback(c);
      }
      break;
    case '%':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_MOD);
      } else {
        token->SetType(TokenType::T_MOD);
        Putback(c);
      }
      break;
    case ',':
      token->SetType(TokenType::T_COMMA);
      break;
    case '.':
      token->SetType(TokenType::T_DOT);
      break;
    case ':':
      token->SetType(TokenType::T_COLON);
      break;
    case '?':
      token->SetType(TokenType::T_QUESTION);
      break;
    case '[':
      token->SetType(TokenType::T_LBRACKET);
      break;
    case ']':
      token->SetType(TokenType::T_RBRACKET);
      break;
    case ';':
      token->SetType(TokenType::T_SEMICOLON);
      break;
    case '(':
      token->SetType(TokenType::T_LPAREN);
      break;
    case ')':
      token->SetType(TokenType::T_RPAREN);
      break;
    case '{':
      token->SetType(TokenType::T_LBRACE);
      break;
    case '}':
      token->SetType(TokenType::T_RBRACE);
      break;
    case '\'':
      token->SetInt(ScanChar());
      token->SetType(TokenType::T_INT_LIT);
      if ((c = Next()) != '\'') {
        reporter_.Report("Char literal should end in quote", c, line_, c_);
        Putback(c);
      }
      break;
    case '"':token->SetString(ScanStr());
      token->SetType(TokenType::T_STR_LIT);
      break;
    case '&':
      if ((c = Next()) == '&') {
        token->SetType(TokenType::T_AND);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_AND);
      } else {
        token->SetType(TokenType::T_BIT_AND);
        Putback(c);
      }
      break;
    case '|':
      if ((c = Next()) == '|') {
        token->SetType(TokenType::T_OR);
      } else if (c == '=') {
        token->SetType(TokenType::T_ASSIGN_OR);
      } else {
        token->SetType(TokenType::T_BIT_OR);
        Putback(c);
      }
      break;
    case '^':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_ASSIGN_XOR);
      } else {
        token->SetType(TokenType::T_BIT_XOR);
        Putback(c);
      }
      break;
    case '>':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_GREATER_EQUAL);
      } else if (c == '>') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_RSHIFT);
        } else {
          token->SetType(TokenType::T_RSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_GREATER);
        Putback(c);
      }
      break;
    case '<':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_LESS_EQUAL);
      } else if (c == '<') {
        if ((c = Next()) == '=') {
          token->SetType(TokenType::T_ASSIGN_LSHIFT);
        } else {
          token->SetType(TokenType::T_LSHIFT);
          Putback(c);
        }
      } else {
        token->SetType(TokenType::T_LESS);
        Putback(c);
      }
      break;
    case '~':
      token->SetType(TokenType::T_NEG);
      break;
    case '!':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_NOT_EQUALS);
      } else {
        token->SetType(TokenType::T_NOT);
        Putback(c);
      }
      break;
    case '=':
      if ((c = Next()) == '=') {
        token->SetType(TokenType::T_EQUALS);
      } else {
        token->SetType(TokenType::T_ASSIGN);
        Putback(c);
      }
      break;
    case EOF:
      token->SetType(TokenType::T_EOF);
      break;
    default:
      if (std::isdigit(c)) {
        int value = ScanInt(c - '0');
        token->SetInt(value);
        token->SetType(TokenType::T_INT_LIT);
      } else if (std::isalpha(c) || c == '_') {
        std::string identifier = ScanIdent(c);
        if (IsKeyword(identifier)) {
          token->SetType(GetKeywordToken(identifier));
        } else {
          token->SetType(TokenType::T_IDENTIFIER);
          token->SetString(identifier);
        }
      } else {
        reporter_.Report("Unrecognizable token", c, line_, c_);
      }
  }

  return token;
}